

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O2

void __thiscall
duckdb::StreamingWindowState::AggregateState::Execute
          (AggregateState *this,ExecutionContext *context,DataChunk *input,Vector *result)

{
  SelectionVector *sel_00;
  DataChunk *result_00;
  DataChunk *pDVar1;
  ulong count;
  sel_t *psVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  size_type __n;
  pointer puVar5;
  type pAVar6;
  ulong uVar7;
  pointer this_00;
  reference pvVar8;
  Vector *pVVar9;
  reference pvVar10;
  idx_t iVar11;
  ulong uVar12;
  idx_t iVar13;
  long lVar14;
  pointer puVar15;
  ValidityMask filter_mask;
  AggregateInputData aggr_input_data;
  ValidityMask distinct_mask;
  SelectionVector sel;
  sel_t s;
  vector<unsigned_long,_true> structs;
  
  count = input->count;
  pAVar6 = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
           ::operator*(&this->wexpr->aggregate);
  filter_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  filter_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
  filter_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  filter_mask.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  sel_00 = &this->filter_sel;
  uVar7 = count;
  if ((Expression *)
      (this->wexpr->filter_expr).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false> != (Expression *)0x0) {
    uVar7 = ExpressionExecutor::SelectExpression(&this->filter_executor,input,sel_00);
    if (uVar7 < count) {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&filter_mask.super_TemplatedValidityMask<unsigned_long>,count);
      TemplatedValidityMask<unsigned_long>::SetAllInvalid
                (&filter_mask.super_TemplatedValidityMask<unsigned_long>,count);
      psVar2 = sel_00->sel_vector;
      for (iVar13 = 0; uVar7 != iVar13; iVar13 = iVar13 + 1) {
        iVar11 = iVar13;
        if (psVar2 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar2[iVar13];
        }
        if (filter_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          filter_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar11 >> 6] =
               filter_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar11 >> 6] |
               1L << ((byte)iVar11 & 0x3f);
        }
      }
    }
  }
  if ((this->wexpr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->wexpr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pdVar3 = result->data;
    for (uVar7 = 0; count != uVar7; uVar7 = uVar7 + 1) {
      uVar12 = 1;
      if (filter_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        uVar12 = (ulong)((filter_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask
                          [uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0);
      }
      lVar14 = uVar12 + this->unfiltered;
      this->unfiltered = lVar14;
      *(long *)(pdVar3 + uVar7 * 8) = lVar14;
    }
  }
  else {
    result_00 = &this->arg_chunk;
    ExpressionExecutor::Execute(&this->executor,input,result_00);
    DataChunk::Flatten(result_00);
    distinct_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    distinct_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
    distinct_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    distinct_mask.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
    if ((this->distinct).
        super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
        .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl !=
        (GroupedAggregateHashTable *)0x0) {
      pDVar1 = &this->distinct_args;
      DataChunk::Reference(pDVar1,result_00);
      if ((Expression *)
          (this->wexpr->filter_expr).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> != (Expression *)0x0) {
        DataChunk::Slice(pDVar1,sel_00,uVar7);
      }
      if (uVar7 == 0) {
        iVar13 = 0;
      }
      else {
        DataChunk::Hash(pDVar1,&this->hashes);
        this_00 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                  ::operator->(&this->distinct);
        iVar13 = GroupedAggregateHashTable::FindOrCreateGroups
                           (this_00,pDVar1,&this->hashes,&this->addresses,&this->distinct_sel);
      }
      if (iVar13 < uVar7) {
        TemplatedValidityMask<unsigned_long>::Initialize
                  (&distinct_mask.super_TemplatedValidityMask<unsigned_long>,count);
        TemplatedValidityMask<unsigned_long>::SetAllInvalid
                  (&distinct_mask.super_TemplatedValidityMask<unsigned_long>,count);
        psVar2 = (this->distinct_sel).sel_vector;
        psVar4 = sel_00->sel_vector;
        for (uVar7 = 0; iVar13 != uVar7; uVar7 = uVar7 + 1) {
          uVar12 = uVar7;
          if (psVar2 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar2[uVar7];
          }
          if (psVar4 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar4[uVar12];
          }
          if (distinct_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            distinct_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar12 >> 6] =
                 distinct_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar12 >> 6]
                 | 1L << ((byte)uVar12 & 0x3f);
          }
        }
      }
    }
    s = 0;
    SelectionVector::SelectionVector(&sel,&s);
    pDVar1 = &this->arg_cursor;
    DataChunk::Reset(pDVar1);
    DataChunk::Slice(pDVar1,&sel,1);
    structs.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    structs.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    structs.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    aggr_input_data.bind_data.ptr = (FunctionData *)0x0;
    while( true ) {
      if ((FunctionData *)
          (((long)(this->arg_chunk).data.
                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)(this->arg_chunk).data.
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x68) <= aggr_input_data.bind_data.ptr) break;
      pvVar8 = vector<duckdb::Vector,_true>::get<true>
                         (&pDVar1->data,(size_type)aggr_input_data.bind_data.ptr);
      pVVar9 = DictionaryVector::Child(pvVar8);
      pvVar10 = vector<duckdb::Vector,_true>::get<true>
                          (&result_00->data,(size_type)aggr_input_data.bind_data.ptr);
      Vector::Reference(pVVar9,pvVar10);
      if ((pvVar8->type).physical_type_ == STRUCT) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&structs,
                   (unsigned_long *)&aggr_input_data);
      }
      aggr_input_data.bind_data.ptr =
           (FunctionData *)((long)&(aggr_input_data.bind_data.ptr)->_vptr_FunctionData + 1);
    }
    aggr_input_data.bind_data.ptr =
         (this->wexpr->bind_info).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    aggr_input_data.allocator = &this->arena_allocator;
    aggr_input_data.combine_type = PRESERVE_INPUT;
    for (uVar7 = 0;
        puVar5 = structs.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish, uVar7 != count; uVar7 = uVar7 + 1) {
      *sel.sel_vector = (sel_t)uVar7;
      for (puVar15 = structs.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar15 != puVar5; puVar15 = puVar15 + 1) {
        __n = *puVar15;
        pvVar8 = vector<duckdb::Vector,_true>::get<true>(&pDVar1->data,__n);
        pvVar10 = vector<duckdb::Vector,_true>::get<true>(&result_00->data,__n);
        Vector::Slice(pvVar8,pvVar10,&sel,1);
      }
      if (((filter_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((filter_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6] >>
            (uVar7 & 0x3f) & 1) != 0)) &&
         ((distinct_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((distinct_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6] >>
            (uVar7 & 0x3f) & 1) != 0)))) {
        pVVar9 = (this->arg_cursor).data.
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (*pAVar6->update)(pVVar9,&aggr_input_data,
                          ((long)(this->arg_cursor).data.
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9) / 0x68,
                          &this->statev,1);
      }
      (*pAVar6->finalize)(&this->statev,&aggr_input_data,result,1,uVar7);
    }
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&structs);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&distinct_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&filter_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void StreamingWindowState::AggregateState::Execute(ExecutionContext &context, DataChunk &input, Vector &result) {
	//	Establish the aggregation environment
	const idx_t count = input.size();
	auto &aggregate = *wexpr.aggregate;
	auto &aggr_state = *this;
	auto &statev = aggr_state.statev;

	// Compute the FILTER mask (if any)
	ValidityMask filter_mask;
	auto filtered = count;
	auto &filter_sel = aggr_state.filter_sel;
	if (wexpr.filter_expr) {
		filtered = filter_executor.SelectExpression(input, filter_sel);
		if (filtered < count) {
			filter_mask.Initialize(count);
			filter_mask.SetAllInvalid(count);
			for (idx_t f = 0; f < filtered; ++f) {
				filter_mask.SetValid(filter_sel.get_index(f));
			}
		}
	}

	// Check for COUNT(*)
	if (wexpr.children.empty()) {
		D_ASSERT(GetTypeIdSize(result.GetType().InternalType()) == sizeof(int64_t));
		auto data = FlatVector::GetData<int64_t>(result);
		auto &unfiltered = aggr_state.unfiltered;
		for (idx_t i = 0; i < count; ++i) {
			unfiltered += int64_t(filter_mask.RowIsValid(i));
			data[i] = unfiltered;
		}
		return;
	}

	// Compute the arguments
	auto &arg_chunk = aggr_state.arg_chunk;
	executor.Execute(input, arg_chunk);
	arg_chunk.Flatten();

	// Update the distinct hash table
	ValidityMask distinct_mask;
	if (aggr_state.distinct) {
		auto &distinct_args = aggr_state.distinct_args;
		distinct_args.Reference(arg_chunk);
		if (wexpr.filter_expr) {
			distinct_args.Slice(filter_sel, filtered);
		}
		idx_t distinct = 0;
		auto &distinct_sel = aggr_state.distinct_sel;
		if (filtered) {
			// FindOrCreateGroups assumes non-empty input
			auto &hashes = aggr_state.hashes;
			distinct_args.Hash(hashes);

			auto &addresses = aggr_state.addresses;
			distinct = aggr_state.distinct->FindOrCreateGroups(distinct_args, hashes, addresses, distinct_sel);
		}

		//	Translate the distinct selection from filtered row numbers
		//	back to input row numbers. We need to produce output for all input rows,
		//	so we filter out
		if (distinct < filtered) {
			distinct_mask.Initialize(count);
			distinct_mask.SetAllInvalid(count);
			for (idx_t d = 0; d < distinct; ++d) {
				const auto f = distinct_sel.get_index(d);
				distinct_mask.SetValid(filter_sel.get_index(f));
			}
		}
	}

	// Iterate through them using a single SV
	sel_t s = 0;
	SelectionVector sel(&s);
	auto &arg_cursor = aggr_state.arg_cursor;
	arg_cursor.Reset();
	arg_cursor.Slice(sel, 1);
	// This doesn't work for STRUCTs because the SV
	// is not copied to the children when you slice
	vector<column_t> structs;
	for (column_t col_idx = 0; col_idx < arg_chunk.ColumnCount(); ++col_idx) {
		auto &col_vec = arg_cursor.data[col_idx];
		DictionaryVector::Child(col_vec).Reference(arg_chunk.data[col_idx]);
		if (col_vec.GetType().InternalType() == PhysicalType::STRUCT) {
			structs.emplace_back(col_idx);
		}
	}

	// Update the state and finalize it one row at a time.
	AggregateInputData aggr_input_data(wexpr.bind_info.get(), aggr_state.arena_allocator);
	for (idx_t i = 0; i < count; ++i) {
		sel.set_index(0, i);
		for (const auto struct_idx : structs) {
			arg_cursor.data[struct_idx].Slice(arg_chunk.data[struct_idx], sel, 1);
		}
		if (filter_mask.RowIsValid(i) && distinct_mask.RowIsValid(i)) {
			aggregate.update(arg_cursor.data.data(), aggr_input_data, arg_cursor.ColumnCount(), statev, 1);
		}
		aggregate.finalize(statev, aggr_input_data, result, 1, i);
	}
}